

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartsBupOutputter.cpp
# Opt level: O0

void __thiscall PartsBupOutputter::writeJSON(PartsBupOutputter *this)

{
  Blend BVar1;
  bool bVar2;
  ostream *poVar3;
  reference ppVar4;
  long in_RDI;
  pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *part;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range3;
  ImageEntry *img;
  const_iterator __end2;
  const_iterator __begin2;
  vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_> *__range2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>
  *exp;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_>_>
  *__range1;
  anon_class_8_1_ba1d6aae lastComma;
  ofstream out;
  path name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffca8;
  path *in_stack_fffffffffffffcb0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>
  *in_stack_fffffffffffffcb8;
  ostream *in_stack_fffffffffffffcc0;
  path *in_stack_fffffffffffffcd0;
  path *in_stack_fffffffffffffcd8;
  __normal_iterator<const_std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_2e0;
  reference local_2d8;
  reference local_2d0;
  ImageEntry *local_2c8;
  __normal_iterator<const_PartsBupOutputter::ImageEntry_*,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>
  local_2c0;
  vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_> *local_2b8;
  reference local_2b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>
  *local_2a8;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_>_>_>
  local_2a0;
  long local_298;
  ostream *local_290;
  ostream local_288 [528];
  string local_78 [120];
  
  std::operator+(&in_stack_fffffffffffffcd8->_M_pathname,(char *)in_stack_fffffffffffffcd0);
  std::filesystem::__cxx11::u8path<std::__cxx11::string,std::filesystem::__cxx11::path,char>
            (in_stack_fffffffffffffca8);
  std::filesystem::__cxx11::operator/(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffcb0);
  std::__cxx11::string::~string(local_78);
  std::ofstream::ofstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            ((basic_ofstream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffcc0,
             (path *)in_stack_fffffffffffffcb8,(openmode)((ulong)in_stack_fffffffffffffcb0 >> 0x20))
  ;
  local_290 = local_288;
  poVar3 = std::operator<<(local_290,"{");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_298 = in_RDI + 0x130;
  local_2a0._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>
        *)std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_>_>
          ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_>_>
                   *)in_stack_fffffffffffffca8);
  local_2a8 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>
               *)std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_>_>
                 ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_>_>
                        *)in_stack_fffffffffffffca8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_>_>_>
                             *)in_stack_fffffffffffffcb0,
                            (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_>_>_>
                             *)in_stack_fffffffffffffca8), bVar2) {
    local_2b0 = __gnu_cxx::
                __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_>_>_>
                ::operator*(&local_2a0);
    poVar3 = std::operator<<(local_288,"\t\"");
    poVar3 = std::operator<<(poVar3,(string *)local_2b0);
    poVar3 = std::operator<<(poVar3,"\": [");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_2b8 = &local_2b0->second;
    local_2c0._M_current =
         (ImageEntry *)
         std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>
         ::begin((vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>
                  *)in_stack_fffffffffffffca8);
    local_2c8 = (ImageEntry *)
                std::
                vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>
                ::end((vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>
                       *)in_stack_fffffffffffffca8);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_PartsBupOutputter::ImageEntry_*,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>
                               *)in_stack_fffffffffffffcb0,
                              (__normal_iterator<const_PartsBupOutputter::ImageEntry_*,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>
                               *)in_stack_fffffffffffffca8), bVar2) {
      local_2d0 = __gnu_cxx::
                  __normal_iterator<const_PartsBupOutputter::ImageEntry_*,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>
                  ::operator*(&local_2c0);
      poVar3 = std::operator<<(local_288,"\t\t{");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::operator<<(local_288,"\t\t\t\"blend\": \"");
      BVar1 = local_2d0->color;
      if (BVar1 == AlphaBlend) {
        std::operator<<(local_288,"AlphaBlend");
      }
      else if (BVar1 == CustomBlend) {
        std::operator<<(local_288,"CustomBlend");
      }
      else if (BVar1 == NotPossible) {
        std::operator<<(local_288,"NotPossible");
      }
      in_stack_fffffffffffffcc0 = std::operator<<(local_288,"\",");
      std::ostream::operator<<(in_stack_fffffffffffffcc0,std::endl<char,std::char_traits<char>>);
      in_stack_fffffffffffffcb8 =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>
            *)std::operator<<(local_288,"\t\t\t\"parts\": [");
      std::ostream::operator<<(in_stack_fffffffffffffcb8,std::endl<char,std::char_traits<char>>);
      local_2d8 = local_2d0;
      local_2e0._M_current =
           (pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::
              vector<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::begin((vector<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffffca8);
      std::
      vector<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::end((vector<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)in_stack_fffffffffffffca8);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)in_stack_fffffffffffffcb0,
                                (__normal_iterator<const_std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)in_stack_fffffffffffffca8), bVar2) {
        ppVar4 = __gnu_cxx::
                 __normal_iterator<const_std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator*(&local_2e0);
        std::operator<<(local_288,"\t\t\t\t{\"path\": \"");
        std::operator<<(local_288,(string *)&ppVar4->second);
        std::operator<<(local_288,"\", \"x\": ");
        std::ostream::operator<<(local_288,(ppVar4->first).x);
        std::operator<<(local_288,", \"y\": ");
        std::ostream::operator<<(local_288,(ppVar4->first).y);
        std::operator<<(local_288,"}");
        writeJSON()::{lambda(auto:1_const&,auto:2_const&)#1}::operator()
                  ((anon_class_8_1_ba1d6aae *)in_stack_fffffffffffffcc0,
                   (pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffcb8,
                   (vector<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffcb0);
        __gnu_cxx::
        __normal_iterator<const_std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator++(&local_2e0);
      }
      in_stack_fffffffffffffcb0 = (path *)std::operator<<(local_288,"\t\t\t]");
      std::ostream::operator<<(in_stack_fffffffffffffcb0,std::endl<char,std::char_traits<char>>);
      std::operator<<(local_288,"\t\t}");
      writeJSON()::{lambda(auto:1_const&,auto:2_const&)#1}::operator()
                ((anon_class_8_1_ba1d6aae *)in_stack_fffffffffffffcc0,
                 (ImageEntry *)in_stack_fffffffffffffcb8,
                 (vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>
                  *)in_stack_fffffffffffffcb0);
      __gnu_cxx::
      __normal_iterator<const_PartsBupOutputter::ImageEntry_*,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>
      ::operator++(&local_2c0);
    }
    std::operator<<(local_288,"\t]");
    writeJSON()::{lambda(auto:1_const&,auto:2_const&)#1}::operator()
              ((anon_class_8_1_ba1d6aae *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
               (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_>_>
                *)in_stack_fffffffffffffcb0);
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_>_>_>
    ::operator++(&local_2a0);
  }
  poVar3 = std::operator<<(local_288,"}");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ofstream::~ofstream(local_288);
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffcb0);
  return;
}

Assistant:

void writeJSON() {
		fs::path name = basePath/fs::u8path(baseName + ".json");
		// When you didn't bother to import a json library
		// Hopefully no one puts weird characters in their expression names
#ifdef USE_BOOST_FS
		fs::ofstream out(name, std::ios::binary);
#else
		std::ofstream out(name, std::ios::binary);
#endif

		auto lastComma = [&](const auto& item, const auto& arr){
			if (&item != &arr.back()) {
				out << ",";
			}
			out << std::endl;
		};

		out << "{" << std::endl;
		for (const auto& exp : expressions) {
			out << "\t\"" << exp.first << "\": [" << std::endl;
			for (const auto& img : exp.second) {
				out << "\t\t{" << std::endl;
				out << "\t\t\t\"blend\": \"";
				switch (img.color) {
#define OUT(x) case Blend::x: out << #x; break;
						OUT(AlphaBlend)
						OUT(CustomBlend)
						OUT(NotPossible)
#undef OUT
				}
				out << "\"," << std::endl;
				out << "\t\t\t\"parts\": [" << std::endl;
				for (const auto& part : img.parts) {
					out << "\t\t\t\t{\"path\": \"";
					out << part.second;
					out << "\", \"x\": ";
					out << part.first.x;
					out << ", \"y\": ";
					out << part.first.y;
					out << "}";
					lastComma(part, img.parts);
				}
				out << "\t\t\t]" << std::endl;
				out << "\t\t}";
				lastComma(img, exp.second);
			}
			out << "\t]";
			lastComma(exp, expressions);
		}
		out << "}" << std::endl;
	}